

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_helper.h
# Opt level: O3

void serialization::
     serialize_container_helper<serialization::xml_oarchive,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>>
               (xml_oarchive *ar,
               vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
               *v)

{
  pointer pvVar1;
  pointer pvVar2;
  int *piVar3;
  xml_node<char> *pxVar4;
  int *i_2;
  int *piVar5;
  vector<int,_std::allocator<int>_> *i_1;
  pointer pvVar6;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *i;
  pointer pvVar7;
  
  xml_oarchive::save_sequence_start
            (ar,(int)((ulong)((long)(v->
                                    super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(v->
                                   super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555);
  pvVar7 = (v->
           super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (v->
           super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar7 == pvVar1) {
    pxVar4 = ar->current_;
  }
  else {
    do {
      xml_oarchive::save_sequence_item_start(ar);
      xml_oarchive::save_sequence_start
                (ar,(int)((ulong)((long)(pvVar7->
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pvVar7->
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start) >> 3) *
                    -0x55555555);
      pvVar6 = (pvVar7->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pvVar2 = (pvVar7->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pvVar6 == pvVar2) {
        pxVar4 = ar->current_;
      }
      else {
        do {
          xml_oarchive::save_sequence_item_start(ar);
          xml_oarchive::save_sequence_start
                    (ar,(size_type)
                        ((ulong)((long)(pvVar6->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)(pvVar6->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_start) >> 2));
          piVar5 = (pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          piVar3 = (pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          if (piVar5 == piVar3) {
            pxVar4 = ar->current_;
          }
          else {
            do {
              xml_oarchive::save_sequence_item_start(ar);
              xml_oarchive::save(ar,*piVar5);
              pxVar4 = (ar->current_->super_xml_base<char>).m_parent;
              ar->current_ = pxVar4;
              piVar5 = piVar5 + 1;
            } while (piVar5 != piVar3);
          }
          pxVar4 = (((pxVar4->super_xml_base<char>).m_parent)->super_xml_base<char>).m_parent;
          ar->current_ = pxVar4;
          pvVar6 = pvVar6 + 1;
        } while (pvVar6 != pvVar2);
      }
      pxVar4 = (((pxVar4->super_xml_base<char>).m_parent)->super_xml_base<char>).m_parent;
      ar->current_ = pxVar4;
      pvVar7 = pvVar7 + 1;
    } while (pvVar7 != pvVar1);
  }
  ar->current_ = (pxVar4->super_xml_base<char>).m_parent;
  return;
}

Assistant:

inline void serialize_container_helper(Archive & ar, const T & v)
{
    serialization_trace trace(__func__, __FILE__, __LINE__);

    ar.save_sequence_start(v.size());
    for(const auto & i : v)
    {
        ar.save_sequence_item_start();
        serialize_helper(ar, i);
        ar.save_sequence_item_end();
    }
    ar.save_sequence_end();
}